

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool el::Configurations::Parser::parseLine
               (string *line,string *currConfigStr,string *currLevelStr,Level *currLevel,
               Configurations *conf)

{
  ulong uVar1;
  byte bVar2;
  size_type sVar3;
  pointer pcVar4;
  char *pcVar5;
  Level *pLVar6;
  bool bVar7;
  int iVar8;
  Level LVar9;
  ulong uVar10;
  ulong uVar11;
  ostream *poVar12;
  undefined8 uVar13;
  bool bVar14;
  size_type sVar15;
  long lVar16;
  string currValue;
  stringstream internalInfoStream;
  ConfigurationType local_21c;
  char *local_210;
  long local_208;
  char local_200 [16];
  string local_1f0;
  ulong local_1d0;
  Level *local_1c8;
  Configurations *local_1c0;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1c8 = currLevel;
  local_1c0 = conf;
  base::utils::Str::rtrim(line);
  base::utils::Str::ltrim(line);
  std::__cxx11::string::_M_assign((string *)line);
  bVar7 = isComment(line);
  bVar14 = true;
  if (bVar7) goto LAB_00160240;
  ignoreComments(line);
  base::utils::Str::rtrim(line);
  base::utils::Str::ltrim(line);
  std::__cxx11::string::_M_assign((string *)line);
  if (line->_M_string_length == 0) goto LAB_00160240;
  bVar7 = isLevel(line);
  if (bVar7) {
    if (2 < line->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
      std::__cxx11::string::operator=((string *)currLevelStr,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
      sVar3 = currLevelStr->_M_string_length;
      if (sVar3 != 0) {
        pcVar4 = (currLevelStr->_M_dataplus)._M_p;
        sVar15 = 0;
        do {
          iVar8 = toupper((int)pcVar4[sVar15]);
          pcVar4[sVar15] = (char)iVar8;
          sVar15 = sVar15 + 1;
        } while (sVar3 != sVar15);
      }
      std::__cxx11::string::_M_assign((string *)currLevelStr);
      base::utils::Str::rtrim(currLevelStr);
      base::utils::Str::ltrim(currLevelStr);
      std::__cxx11::string::_M_assign((string *)currLevelStr);
      pcVar5 = (currLevelStr->_M_dataplus)._M_p;
      lVar16 = 0;
      do {
        bVar7 = base::utils::Str::cStringCaseEq(pcVar5,*(char **)((long)&stringToLevelMap + lVar16))
        ;
        if (bVar7) {
          LVar9 = *(Level *)((long)&DAT_001931c8 + lVar16);
          goto LAB_0015fad7;
        }
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x80);
      LVar9 = Unknown;
LAB_0015fad7:
      *local_1c8 = LVar9;
    }
    goto LAB_00160240;
  }
  uVar10 = std::__cxx11::string::find((char)line,0x3d);
  iVar8 = std::__cxx11::string::compare((char *)line);
  local_21c = Unknown;
  if ((iVar8 != 0) && (bVar2 = *(line->_M_dataplus)._M_p, '@' < (char)bVar2)) {
    if (bVar2 < 0x5b) {
      if (uVar10 != 0xffffffffffffffff) {
LAB_0015fb02:
        if (uVar10 < line->_M_string_length) {
          std::__cxx11::string::find((char)line,0x3d);
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
          std::__cxx11::string::operator=((string *)currConfigStr,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0]);
          }
          sVar3 = currConfigStr->_M_string_length;
          if (sVar3 != 0) {
            pcVar4 = (currConfigStr->_M_dataplus)._M_p;
            sVar15 = 0;
            do {
              iVar8 = toupper((int)pcVar4[sVar15]);
              pcVar4[sVar15] = (char)iVar8;
              sVar15 = sVar15 + 1;
            } while (sVar3 != sVar15);
          }
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          base::utils::Str::rtrim(currConfigStr);
          base::utils::Str::ltrim(currConfigStr);
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          pcVar5 = (currConfigStr->_M_dataplus)._M_p;
          lVar16 = 8;
          do {
            bVar7 = base::utils::Str::cStringCaseEq(pcVar5,*(char **)(&UNK_00193238 + lVar16));
            if (bVar7) {
              local_21c = *(ConfigurationType *)((long)&configStringToTypeMap + lVar16);
              goto LAB_0015fbf8;
            }
            lVar16 = lVar16 + 0x10;
          } while (lVar16 != 0xa8);
          local_21c = Unknown;
LAB_0015fbf8:
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
          std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0]);
          }
          base::utils::Str::rtrim(&local_1f0);
          base::utils::Str::ltrim(&local_1f0);
          std::__cxx11::string::_M_assign((string *)&local_1f0);
          uVar10 = std::__cxx11::string::find((char *)&local_1f0,0x17d80f,0);
          if (uVar10 != 0xffffffffffffffff) {
            local_1d0 = uVar10 + 1;
            uVar11 = std::__cxx11::string::find((char *)&local_1f0,0x17d80f,local_1d0);
            if (uVar11 != 0xffffffffffffffff) {
              do {
                uVar1 = uVar11 - 1;
                if (local_1f0._M_string_length <= uVar1) {
                  uVar13 = std::__throw_out_of_range_fmt
                                     ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                      ,uVar1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p);
                  }
                  _Unwind_Resume(uVar13);
                }
                if (local_1f0._M_dataplus._M_p[uVar1] != '\\') {
                  if (uVar11 <= uVar10) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,"Configuration error - No ending quote found in [",0x30);
                    poVar12 = std::ostream::_M_insert<void_const*>(local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",
                               0x2c);
                    poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,0x1bb);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,") [(quotesStart < quotesEnd)",0x1c);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,"] WITH MESSAGE \"",0x10);
                    std::__cxx11::stringbuf::str();
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,local_210,local_208);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar12);
                    if (local_210 != local_200) {
                      operator_delete(local_210);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base(local_138);
                  }
                  if (local_1d0 == uVar11) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,"Empty configuration value for [",0x1f);
                    poVar12 = std::ostream::_M_insert<void_const*>(local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",
                               0x2c);
                    poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,0x1bc);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,") [(quotesStart + 1 != quotesEnd)",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,"] WITH MESSAGE \"",0x10);
                    std::__cxx11::stringbuf::str();
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,local_210,local_208);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar12);
                    if (local_210 != local_200) {
                      operator_delete(local_210);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base(local_138);
                  }
                  else if (uVar10 != uVar11) {
                    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_1f0);
                    std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b8);
                    if (local_1b8[0] != local_1a8) {
                      operator_delete(local_1b8[0]);
                    }
                  }
                  break;
                }
                std::__cxx11::string::erase((ulong)&local_1f0,uVar1);
                std::__cxx11::string::_M_assign((string *)&local_1f0);
                uVar11 = std::__cxx11::string::find((char *)&local_1f0,0x17d80f,uVar11 + 2);
              } while (uVar11 != 0xffffffffffffffff);
            }
          }
        }
      }
    }
    else if ((0x60 < bVar2) && (uVar10 != 0xffffffffffffffff && bVar2 < 0x7b)) goto LAB_0015fb02;
  }
  pLVar6 = local_1c8;
  if (*local_1c8 == Unknown) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Unrecognized severity level [",0x1d);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(currLevelStr->_M_dataplus)._M_p,currLevelStr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,0x1c3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,") [*currLevel != Level::Unknown",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_210,local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_21c == Unknown) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Unrecognized configuration [",0x1c);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(currConfigStr->_M_dataplus)._M_p,currConfigStr->_M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,0x1c4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,") [currConfig != ConfigurationType::Unknown",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_210,local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else if (*pLVar6 != Unknown) {
    set(local_1c0,*pLVar6,local_21c,&local_1f0);
    goto LAB_00160240;
  }
  bVar14 = false;
LAB_00160240:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return bVar14;
}

Assistant:

bool Configurations::Parser::parseLine(std::string* line, std::string* currConfigStr, std::string* currLevelStr,
                                       Level* currLevel,
                                       Configurations* conf) {
  ConfigurationType currConfig = ConfigurationType::Unknown;
  std::string currValue = std::string();
  *line = base::utils::Str::trim(*line);
  if (isComment(*line)) return true;
  ignoreComments(line);
  *line = base::utils::Str::trim(*line);
  if (line->empty()) {
    // Comment ignored
    return true;
  }
  if (isLevel(*line)) {
    if (line->size() <= 2) {
      return true;
    }
    *currLevelStr = line->substr(1, line->size() - 2);
    *currLevelStr = base::utils::Str::toUpper(*currLevelStr);
    *currLevelStr = base::utils::Str::trim(*currLevelStr);
    *currLevel = LevelHelper::convertFromString(currLevelStr->c_str());
    return true;
  }
  if (isConfig(*line)) {
    std::size_t assignment = line->find('=');
    *currConfigStr = line->substr(0, assignment);
    *currConfigStr = base::utils::Str::toUpper(*currConfigStr);
    *currConfigStr = base::utils::Str::trim(*currConfigStr);
    currConfig = ConfigurationTypeHelper::convertFromString(currConfigStr->c_str());
    currValue = line->substr(assignment + 1);
    currValue = base::utils::Str::trim(currValue);
    std::size_t quotesStart = currValue.find("\"", 0);
    std::size_t quotesEnd = std::string::npos;
    if (quotesStart != std::string::npos) {
      quotesEnd = currValue.find("\"", quotesStart + 1);
      while (quotesEnd != std::string::npos && currValue.at(quotesEnd - 1) == '\\') {
        currValue = currValue.erase(quotesEnd - 1, 1);
        quotesEnd = currValue.find("\"", quotesEnd + 2);
      }
    }
    if (quotesStart != std::string::npos && quotesEnd != std::string::npos) {
      // Quote provided - check and strip if valid
      ELPP_ASSERT((quotesStart < quotesEnd), "Configuration error - No ending quote found in ["
                  << currConfigStr << "]");
      ELPP_ASSERT((quotesStart + 1 != quotesEnd), "Empty configuration value for [" << currConfigStr << "]");
      if ((quotesStart != quotesEnd) && (quotesStart + 1 != quotesEnd)) {
        // Explicit check in case if assertion is disabled
        currValue = currValue.substr(quotesStart + 1, quotesEnd - 1);
      }
    }
  }
  ELPP_ASSERT(*currLevel != Level::Unknown, "Unrecognized severity level [" << *currLevelStr << "]");
  ELPP_ASSERT(currConfig != ConfigurationType::Unknown, "Unrecognized configuration [" << *currConfigStr << "]");
  if (*currLevel == Level::Unknown || currConfig == ConfigurationType::Unknown) {
    return false;  // unrecognizable level or config
  }
  conf->set(*currLevel, currConfig, currValue);
  return true;
}